

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_status_t bpptree_update(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_result_count_t local_44;
  ion_file_offset_t iStack_40;
  ion_result_count_t count;
  ion_file_offset_t offset;
  ion_dictionary_parent_t *piStack_30;
  ion_bpp_err_t bErr;
  ion_bpptree_t *bpptree;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_dictionary_t *dictionary_local;
  
  local_44 = 0;
  piStack_30 = dictionary->instance;
  bpptree = (ion_bpptree_t *)value;
  value_local = key;
  key_local = dictionary;
  offset._4_4_ = b_get(*(ion_bpp_handle_t *)(piStack_30 + 1),key,&stack0xffffffffffffffc0);
  if (offset._4_4_ == bErrKeyNotFound) {
    dictionary_local =
         (ion_dictionary_t *)bpptree_insert((ion_dictionary_t *)key_local,value_local,bpptree);
  }
  else {
    lfb_update_all((ion_lfb_t *)&piStack_30[1].record.value_size,iStack_40,
                   (piStack_30->record).value_size,(ion_byte_t *)bpptree,&local_44);
    dictionary_local =
         (ion_dictionary_t *)(CONCAT44(local_44,dictionary_local._0_4_) & 0xffffffffffffff00);
  }
  return (ion_status_t)dictionary_local;
}

Assistant:

ion_status_t
bpptree_update(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_file_offset_t	offset;
	ion_result_count_t	count;

	count	= 0;
	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrKeyNotFound != bErr) {
		lfb_update_all(&(bpptree->values), offset, bpptree->super.record.value_size, (ion_byte_t *) value, &count);
	}
	else {
		return bpptree_insert(dictionary, key, value);
	}

	return ION_STATUS_OK(count);
}